

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::cleanup(ShaderCompilerCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  int in_ECX;
  long in_RDX;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (in_ECX != 0) {
    lVar3 = *(long *)(in_RDX + 0x40);
    if (0 < (int)((ulong)(*(long *)(in_RDX + 0x48) - lVar3) >> 5) * -0x55555555) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        iVar1 = (**(code **)(lVar2 + 0x780))
                          (*(undefined4 *)(ctx + 8),*(undefined8 *)(lVar3 + lVar5));
        if (-1 < iVar1) {
          (**(code **)(lVar2 + 0x518))(iVar1);
        }
        lVar4 = lVar4 + 1;
        lVar3 = *(long *)(in_RDX + 0x40);
        lVar5 = lVar5 + 0x60;
      } while (lVar4 < (int)((ulong)(*(long *)(in_RDX + 0x48) - lVar3) >> 5) * -0x55555555);
    }
  }
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x4e0))(*(undefined4 *)(ctx + 8),*(undefined4 *)ctx);
  (**(code **)(lVar2 + 0x4e0))(*(undefined4 *)(ctx + 8),*(undefined4 *)(ctx + 4));
  (**(code **)(lVar2 + 0x470))(*(undefined4 *)ctx);
  (**(code **)(lVar2 + 0x470))(*(undefined4 *)(ctx + 4));
  (**(code **)(lVar2 + 0x448))(*(undefined4 *)(ctx + 8));
  return;
}

Assistant:

void ShaderCompilerCase::cleanup (const ShadersAndProgram& shadersAndProgram, const ProgramContext& progCtx, bool linkSuccess) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (linkSuccess)
	{
		for (int attribNdx = 0; attribNdx < (int)progCtx.vertexAttributes.size(); attribNdx++)
		{
			int location = gl.getAttribLocation(shadersAndProgram.program, progCtx.vertexAttributes[attribNdx].name.c_str());
			if (location >= 0)
				gl.disableVertexAttribArray(location);
		}
	}

	gl.useProgram(0);
	gl.detachShader(shadersAndProgram.program, shadersAndProgram.vertShader);
	gl.detachShader(shadersAndProgram.program, shadersAndProgram.fragShader);
	gl.deleteShader(shadersAndProgram.vertShader);
	gl.deleteShader(shadersAndProgram.fragShader);
	gl.deleteProgram(shadersAndProgram.program);
}